

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::Seek(DBIter *this,Slice *target)

{
  Iterator *pIVar1;
  uint uVar2;
  Slice local_48;
  ParsedInternalKey local_38;
  Slice *local_18;
  Slice *target_local;
  DBIter *this_local;
  
  this->direction_ = kForward;
  local_18 = target;
  target_local = (Slice *)this;
  ClearSavedValue(this);
  std::__cxx11::string::clear();
  ParsedInternalKey::ParsedInternalKey(&local_38,local_18,&this->sequence_,kTypeValue);
  AppendInternalKey(&this->saved_key_,&local_38);
  pIVar1 = this->iter_;
  Slice::Slice(&local_48,&this->saved_key_);
  (*pIVar1->_vptr_Iterator[5])();
  uVar2 = (*this->iter_->_vptr_Iterator[2])();
  if ((uVar2 & 1) == 0) {
    this->valid_ = false;
  }
  else {
    FindNextUserEntry(this,false,&this->saved_key_);
  }
  return;
}

Assistant:

void DBIter::Seek(const Slice& target) {
  direction_ = kForward;
  ClearSavedValue();
  saved_key_.clear();
  AppendInternalKey(&saved_key_,
                    ParsedInternalKey(target, sequence_, kValueTypeForSeek));
  iter_->Seek(saved_key_);
  if (iter_->Valid()) {
    FindNextUserEntry(false, &saved_key_ /* temporary storage */);
  } else {
    valid_ = false;
  }
}